

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

int __thiscall
FStateDefinitions::FinishStates(FStateDefinitions *this,PClassActor *actor,AActor *defaults)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  FState *firststate;
  FState *pFVar4;
  FState *local_58;
  int local_34;
  int i;
  FState *realstates;
  int count;
  AActor *defaults_local;
  PClassActor *actor_local;
  FStateDefinitions *this_local;
  
  uVar2 = TArray<FState,_FState>::Size(&this->StateArray);
  if ((int)uVar2 < 1) {
    ResolveGotoLabels(this,actor,defaults,&this->StateLabels);
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x28),0);
    if (SUB168(auVar1 * ZEXT816(0x28),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    firststate = (FState *)operator_new__(uVar3);
    pFVar4 = TArray<FState,_FState>::operator[](&this->StateArray,0);
    memcpy(firststate,pFVar4,(long)(int)uVar2 * 0x28);
    actor->OwnedStates = firststate;
    actor->NumOwnedStates = uVar2;
    SaveStateSourceLines(firststate,&this->SourceLines);
    FixStatePointers(actor,&this->StateLabels);
    ResolveGotoLabels(this,actor,defaults,&this->StateLabels);
    for (local_34 = 0; local_34 < (int)uVar2; local_34 = local_34 + 1) {
      switch(firststate[local_34].DefineFlags) {
      case '\0':
        local_58 = firststate;
        if (local_34 < (int)(uVar2 - 1)) {
          local_58 = firststate + (local_34 + 1);
        }
        firststate[local_34].NextState = local_58;
        break;
      case '\x02':
        firststate[local_34].NextState = (FState *)0x0;
        break;
      case '\x03':
        firststate[local_34].NextState = firststate + local_34;
        break;
      case '\x04':
        pFVar4 = ResolveGotoLabel(this,defaults,actor,(char *)firststate[local_34].NextState);
        firststate[local_34].NextState = pFVar4;
        break;
      case '\x05':
        firststate[local_34].NextState =
             firststate + (long)((long)&firststate[local_34].NextState[-1].Misc2 + 3);
      }
    }
  }
  return uVar2;
}

Assistant:

int FStateDefinitions::FinishStates(PClassActor *actor, AActor *defaults)
{
	int count = StateArray.Size();

	if (count > 0)
	{
		FState *realstates = new FState[count];
		int i;

		memcpy(realstates, &StateArray[0], count*sizeof(FState));
		actor->OwnedStates = realstates;
		actor->NumOwnedStates = count;
		SaveStateSourceLines(realstates, SourceLines);

		// adjust the state pointers
		// In the case new states are added these must be adjusted, too!
		FixStatePointers(actor, StateLabels);

		// Fix state pointers that are gotos
		ResolveGotoLabels(actor, defaults, StateLabels);

		for (i = 0; i < count; i++)
		{
			// resolve labels and jumps
			switch (realstates[i].DefineFlags)
			{
			case SDF_STOP:		// stop
				realstates[i].NextState = NULL;
				break;

			case SDF_WAIT:		// wait
				realstates[i].NextState = &realstates[i];
				break;

			case SDF_NEXT:		// next
				realstates[i].NextState = (i < count-1 ? &realstates[i+1] : &realstates[0]);
				break;

			case SDF_INDEX:		// loop
				realstates[i].NextState = &realstates[(size_t)realstates[i].NextState-1];
				break;

			case SDF_LABEL:
				realstates[i].NextState = ResolveGotoLabel(defaults, actor, (char *)realstates[i].NextState);
				break;
			}
		}
	}
	else
	{
		// Fix state pointers that are gotos
		ResolveGotoLabels(actor, defaults, StateLabels);
	}
	return count;
}